

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkFaninFanoutCounters
               (Abc_Ntk_t *pNtk,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  int iVar1;
  int i_00;
  Abc_Obj_t *pAVar2;
  int local_4c;
  int local_48;
  int nFanoutsMax;
  int nFaninsMax;
  int nFanouts;
  int nFanins;
  int i;
  Abc_Obj_t *pNode;
  Vec_Int_t *vFonR_local;
  Vec_Int_t *vFanR_local;
  Vec_Int_t *vFon_local;
  Vec_Int_t *vFan_local;
  Abc_Ntk_t *pNtk_local;
  
  local_48 = 0;
  local_4c = 0;
  for (nFanouts = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nFanouts < iVar1; nFanouts = nFanouts + 1) {
    pAVar2 = Abc_NtkObj(pNtk,nFanouts);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      iVar1 = Abc_ObjFaninNum(pAVar2);
      local_48 = Abc_MaxInt(local_48,iVar1);
      iVar1 = Abc_ObjFanoutNum(pAVar2);
      local_4c = Abc_MaxInt(local_4c,iVar1);
    }
  }
  Vec_IntFill(vFan,local_48 + 1,0);
  Vec_IntFill(vFon,local_4c + 1,0);
  Vec_IntFill(vFanR,local_48 + 1,0);
  Vec_IntFill(vFonR,local_4c + 1,0);
  nFanouts = Vec_PtrSize(pNtk->vObjs);
  while (nFanouts = nFanouts + -1, -1 < nFanouts) {
    pAVar2 = Abc_NtkObj(pNtk,nFanouts);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      iVar1 = Abc_ObjFaninNum(pAVar2);
      i_00 = Abc_ObjFanoutNum(pAVar2);
      Vec_IntAddToEntry(vFan,iVar1,1);
      Vec_IntAddToEntry(vFon,i_00,1);
      Vec_IntWriteEntry(vFanR,iVar1,nFanouts);
      Vec_IntWriteEntry(vFonR,i_00,nFanouts);
    }
  }
  return;
}

Assistant:

void Abc_NtkFaninFanoutCounters( Abc_Ntk_t * pNtk, Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    Abc_Obj_t * pNode;
    int i, nFanins, nFanouts;
    int nFaninsMax = 0, nFanoutsMax = 0;
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        nFaninsMax  = Abc_MaxInt( nFaninsMax,  Abc_ObjFaninNum(pNode) );
        nFanoutsMax = Abc_MaxInt( nFanoutsMax, Abc_ObjFanoutNum(pNode) );
    }
    Vec_IntFill( vFan, nFaninsMax + 1, 0 );
    Vec_IntFill( vFon, nFanoutsMax + 1, 0 );
    Vec_IntFill( vFanR, nFaninsMax + 1, 0 );
    Vec_IntFill( vFonR, nFanoutsMax + 1, 0 );
    Abc_NtkForEachObjReverse( pNtk, pNode, i )
    {
        nFanins  = Abc_ObjFaninNum( pNode );
        nFanouts = Abc_ObjFanoutNum( pNode );
        Vec_IntAddToEntry( vFan,  nFanins, 1 );
        Vec_IntAddToEntry( vFon, nFanouts, 1 );
        Vec_IntWriteEntry( vFanR, nFanins, i );
        Vec_IntWriteEntry( vFonR, nFanouts, i );
    }
}